

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::cmCTest(cmCTest *this)

{
  mapped_type mVar1;
  bool bVar2;
  char *val;
  string *s;
  mapped_type *pmVar3;
  cmCTestBuildHandler *this_00;
  mapped_type *ppcVar4;
  cmCTestBuildAndTestHandler *this_01;
  cmCTestCoverageHandler *this_02;
  cmCTestScriptHandler *this_03;
  cmCTestTestHandler *this_04;
  cmCTestUpdateHandler *this_05;
  mapped_type this_06;
  cmCTestMemCheckHandler *this_07;
  cmCTestSubmitHandler *this_08;
  cmCTestUploadHandler *this_09;
  pointer ppVar5;
  PartInfo *local_3c8;
  _Self local_3c0;
  _Base_ptr local_3b8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_3b0;
  iterator it;
  key_type local_3a0;
  allocator local_379;
  key_type local_378;
  allocator local_351;
  key_type local_350;
  allocator local_329;
  key_type local_328;
  allocator local_301;
  key_type local_300;
  allocator local_2d9;
  key_type local_2d8;
  allocator local_2b1;
  key_type local_2b0;
  allocator local_289;
  key_type local_288;
  allocator local_261;
  key_type local_260;
  allocator local_239;
  key_type local_238;
  string local_218;
  mapped_type local_1f8;
  allocator local_1f1;
  Part p;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string outOnFail;
  cmCTest *this_local;
  
  std::__cxx11::string::string((string *)&this->ConfigType);
  std::__cxx11::string::string((string *)&this->ScheduleType);
  std::__cxx11::string::string((string *)&this->StopTime);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  ::map(&this->TestingHandlers);
  std::__cxx11::string::string((string *)&this->CTestConfigFile);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->CTestConfiguration);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->CTestConfigurationOverwrites);
  local_3c8 = this->Parts;
  do {
    PartInfo::PartInfo(local_3c8);
    local_3c8 = local_3c8 + 1;
  } while (local_3c8 != (PartInfo *)&this->PartMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
  ::map(&this->PartMap);
  std::__cxx11::string::string((string *)&this->CurrentTag);
  std::__cxx11::string::string((string *)&this->SpecificTrack);
  std::__cxx11::string::string((string *)&this->BinaryDir);
  std::__cxx11::string::string((string *)&this->NotesFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->InitialCommandLineArguments);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->Definitions);
  this->LabelSummary = true;
  this->SubprojectSummary = true;
  this->ParallelLevel = 1;
  this->ParallelLevelSetInCli = false;
  this->TestLoad = 0;
  this->SubmitIndex = 0;
  this->Failover = false;
  this->BatchJobs = false;
  this->ForceNewCTestProcess = false;
  this->TomorrowTag = false;
  this->Verbose = false;
  this->Debug = false;
  this->ShowLineNumbers = false;
  this->Quiet = false;
  this->ExtraVerbose = false;
  this->ProduceXML = false;
  this->ShowOnly = false;
  this->RunConfigurationScript = false;
  this->UseHTTP10 = false;
  this->PrintLabels = false;
  this->CompressTestOutput = true;
  this->TestModel = 0;
  this->MaxTestNameWidth = 0x1e;
  this->InteractiveDebugMode = true;
  this->TimeOut = 0.0;
  this->GlobalTimeout = 0.0;
  this->LastStopTimeout = 0x15180;
  this->CompressXMLFiles = false;
  std::__cxx11::string::operator=((string *)&this->CTestConfigFile,"");
  std::__cxx11::string::operator=((string *)&this->ScheduleType,"");
  std::__cxx11::string::operator=((string *)&this->StopTime,"");
  this->NextDayStopTime = false;
  this->OutputLogFile = (cmGeneratedFileStream *)0x0;
  this->OutputLogFileLastTag = -1;
  this->SuppressUpdatingCTestConfiguration = false;
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  this->OutputTestOutputOnTestFailure = false;
  this->RepeatTests = 1;
  this->RepeatUntilFail = false;
  std::__cxx11::string::string((string *)local_40);
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE",(string *)local_40);
  if (bVar2) {
    val = (char *)std::__cxx11::string::c_str();
    bVar2 = cmSystemTools::IsOff(val);
    this->OutputTestOutputOnTestFailure = (bool)((bVar2 ^ 0xffU) & 1);
  }
  InitStreams(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"Start",&local_61);
  PartInfo::SetName(this->Parts,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"Update",&local_89);
  PartInfo::SetName(this->Parts + 1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"Configure",&local_b1);
  PartInfo::SetName(this->Parts + 2,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"Build",&local_d9);
  PartInfo::SetName(this->Parts + 3,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"Test",&local_101);
  PartInfo::SetName(this->Parts + 4,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"Coverage",&local_129);
  PartInfo::SetName(this->Parts + 5,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"MemCheck",&local_151);
  PartInfo::SetName(this->Parts + 6,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"Submit",&local_179);
  PartInfo::SetName(this->Parts + 7,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"Notes",&local_1a1);
  PartInfo::SetName(this->Parts + 8,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"ExtraFiles",&local_1c9);
  PartInfo::SetName(this->Parts + 9,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&p,"Upload",&local_1f1);
  PartInfo::SetName(this->Parts + 10,(string *)&p);
  std::__cxx11::string::~string((string *)&p);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  for (local_1f8 = PartStart; mVar1 = local_1f8, local_1f8 != PartCount;
      local_1f8 = local_1f8 + PartUpdate) {
    s = PartInfo::GetName_abi_cxx11_(this->Parts + local_1f8);
    cmsys::SystemTools::LowerCase(&local_218,s);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
             ::operator[](&this->PartMap,&local_218);
    *pmVar3 = mVar1;
    std::__cxx11::string::~string((string *)&local_218);
  }
  this->ShortDateFormat = true;
  this_00 = (cmCTestBuildHandler *)operator_new(0x3b8);
  cmCTestBuildHandler::cmCTestBuildHandler(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"build",&local_239);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_238);
  *ppcVar4 = (mapped_type)this_00;
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  this_01 = (cmCTestBuildAndTestHandler *)operator_new(0x280);
  cmCTestBuildAndTestHandler::cmCTestBuildAndTestHandler(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"buildtest",&local_261);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_260);
  *ppcVar4 = (mapped_type)this_01;
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  this_02 = (cmCTestCoverageHandler *)operator_new(0x1b8);
  cmCTestCoverageHandler::cmCTestCoverageHandler(this_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"coverage",&local_289);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_288);
  *ppcVar4 = (mapped_type)this_02;
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  this_03 = (cmCTestScriptHandler *)operator_new(0x2a8);
  cmCTestScriptHandler::cmCTestScriptHandler(this_03);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"script",&local_2b1);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_2b0);
  *ppcVar4 = (mapped_type)this_03;
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  this_04 = (cmCTestTestHandler *)operator_new(0x790);
  cmCTestTestHandler::cmCTestTestHandler(this_04);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"test",&local_2d9);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_2d8);
  *ppcVar4 = (mapped_type)this_04;
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  this_05 = (cmCTestUpdateHandler *)operator_new(0xc0);
  cmCTestUpdateHandler::cmCTestUpdateHandler(this_05);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"update",&local_301);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_300);
  *ppcVar4 = (mapped_type)this_05;
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  this_06 = (mapped_type)operator_new(0x98);
  cmCTestConfigureHandler::cmCTestConfigureHandler((cmCTestConfigureHandler *)this_06);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"configure",&local_329);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_328);
  *ppcVar4 = this_06;
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  this_07 = (cmCTestMemCheckHandler *)operator_new(0x8e8);
  cmCTestMemCheckHandler::cmCTestMemCheckHandler(this_07);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"memcheck",&local_351);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_350);
  *ppcVar4 = (mapped_type)this_07;
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  this_08 = (cmCTestSubmitHandler *)operator_new(0x168);
  cmCTestSubmitHandler::cmCTestSubmitHandler(this_08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,"submit",&local_379);
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_378);
  *ppcVar4 = (mapped_type)this_08;
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  this_09 = (cmCTestUploadHandler *)operator_new(200);
  cmCTestUploadHandler::cmCTestUploadHandler(this_09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"upload",(allocator *)((long)&it._M_node + 7));
  ppcVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](&this->TestingHandlers,&local_3a0);
  *ppcVar4 = (mapped_type)this_09;
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  ::_Rb_tree_iterator(&local_3b0);
  local_3b8 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
              ::begin(&this->TestingHandlers);
  local_3b0._M_node = local_3b8;
  while( true ) {
    local_3c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
         ::end(&this->TestingHandlers);
    bVar2 = std::operator!=(&local_3b0,&local_3c0);
    if (!bVar2) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
             ::operator->(&local_3b0);
    cmCTestGenericHandler::SetCTestInstance(ppVar5->second,this);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
    ::operator++(&local_3b0);
  }
  cmSystemTools::EnableVSConsoleOutput();
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

cmCTest::cmCTest()
{
  this->LabelSummary = true;
  this->SubprojectSummary = true;
  this->ParallelLevel = 1;
  this->ParallelLevelSetInCli = false;
  this->TestLoad = 0;
  this->SubmitIndex = 0;
  this->Failover = false;
  this->BatchJobs = false;
  this->ForceNewCTestProcess = false;
  this->TomorrowTag = false;
  this->Verbose = false;

  this->Debug = false;
  this->ShowLineNumbers = false;
  this->Quiet = false;
  this->ExtraVerbose = false;
  this->ProduceXML = false;
  this->ShowOnly = false;
  this->RunConfigurationScript = false;
  this->UseHTTP10 = false;
  this->PrintLabels = false;
  this->CompressTestOutput = true;
  this->TestModel = cmCTest::EXPERIMENTAL;
  this->MaxTestNameWidth = 30;
  this->InteractiveDebugMode = true;
  this->TimeOut = 0;
  this->GlobalTimeout = 0;
  this->LastStopTimeout = 24 * 60 * 60;
  this->CompressXMLFiles = false;
  this->CTestConfigFile = "";
  this->ScheduleType = "";
  this->StopTime = "";
  this->NextDayStopTime = false;
  this->OutputLogFile = CM_NULLPTR;
  this->OutputLogFileLastTag = -1;
  this->SuppressUpdatingCTestConfiguration = false;
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  this->OutputTestOutputOnTestFailure = false;
  this->RepeatTests = 1; // default to run each test once
  this->RepeatUntilFail = false;
  std::string outOnFail;
  if (cmSystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE", outOnFail)) {
    this->OutputTestOutputOnTestFailure =
      !cmSystemTools::IsOff(outOnFail.c_str());
  }
  this->InitStreams();

  this->Parts[PartStart].SetName("Start");
  this->Parts[PartUpdate].SetName("Update");
  this->Parts[PartConfigure].SetName("Configure");
  this->Parts[PartBuild].SetName("Build");
  this->Parts[PartTest].SetName("Test");
  this->Parts[PartCoverage].SetName("Coverage");
  this->Parts[PartMemCheck].SetName("MemCheck");
  this->Parts[PartSubmit].SetName("Submit");
  this->Parts[PartNotes].SetName("Notes");
  this->Parts[PartExtraFiles].SetName("ExtraFiles");
  this->Parts[PartUpload].SetName("Upload");

  // Fill the part name-to-id map.
  for (Part p = PartStart; p != PartCount; p = Part(p + 1)) {
    this->PartMap[cmSystemTools::LowerCase(this->Parts[p].GetName())] = p;
  }

  this->ShortDateFormat = true;

  this->TestingHandlers["build"] = new cmCTestBuildHandler;
  this->TestingHandlers["buildtest"] = new cmCTestBuildAndTestHandler;
  this->TestingHandlers["coverage"] = new cmCTestCoverageHandler;
  this->TestingHandlers["script"] = new cmCTestScriptHandler;
  this->TestingHandlers["test"] = new cmCTestTestHandler;
  this->TestingHandlers["update"] = new cmCTestUpdateHandler;
  this->TestingHandlers["configure"] = new cmCTestConfigureHandler;
  this->TestingHandlers["memcheck"] = new cmCTestMemCheckHandler;
  this->TestingHandlers["submit"] = new cmCTestSubmitHandler;
  this->TestingHandlers["upload"] = new cmCTestUploadHandler;

  cmCTest::t_TestingHandlers::iterator it;
  for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
       ++it) {
    it->second->SetCTestInstance(this);
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();
}